

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O1

void __thiscall chrono::collision::ChCollisionSystemBullet::Clear(ChCollisionSystemBullet *this)

{
  cbtDispatcher *pcVar1;
  uint uVar2;
  int iVar3;
  cbtPersistentManifold *in_RAX;
  undefined4 extraout_var;
  cbtManifoldPoint *pt;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  cbtPersistentManifold *local_38;
  cbtPersistentManifold *this_00;
  
  local_38 = in_RAX;
  uVar2 = (*this->bt_collision_world->m_dispatcher1->_vptr_cbtDispatcher[9])();
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      pcVar1 = this->bt_collision_world->m_dispatcher1;
      iVar3 = (*pcVar1->_vptr_cbtDispatcher[10])(pcVar1,uVar5);
      this_00 = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar3);
      iVar3 = this_00->m_cachedPoints;
      if (0 < iVar3) {
        pt = this_00->m_pointCache;
        lVar6 = 0;
        do {
          cbtPersistentManifold::clearUserCache(this_00,pt);
          lVar6 = lVar6 + 1;
          iVar3 = this_00->m_cachedPoints;
          pt = pt + 1;
        } while (lVar6 < iVar3);
      }
      if (iVar3 != 0 && gContactEndedCallback != (ContactEndedCallback)0x0) {
        local_38 = this_00;
        (*gContactEndedCallback)(&local_38);
      }
      this_00->m_cachedPoints = 0;
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 != uVar2);
  }
  return;
}

Assistant:

void ChCollisionSystemBullet::Clear(void) {
    int numManifolds = bt_collision_world->getDispatcher()->getNumManifolds();
    for (int i = 0; i < numManifolds; i++) {
        cbtPersistentManifold* contactManifold = bt_collision_world->getDispatcher()->getManifoldByIndexInternal(i);
        contactManifold->clearManifold();
    }
}